

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_text.c
# Opt level: O3

void test_acl_from_text(void)

{
  wchar_t wVar1;
  archive_entry *entry;
  wchar_t *pwVar2;
  
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                   ,L'Ė',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  wVar1 = archive_entry_acl_from_text
                    (entry,
                     "user::rwx\ngroup::r-x\nother::r-x\nuser:user100:r-x:100\nuser:user1000:---:1000\ngroup:group78:rwx:78"
                     ,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'ě',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text(ae, acltext[5], ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'ĝ',entry,(archive_test_acl_t *)acls0,L'\v',L'Ā',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'ğ',6,"6",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  wVar1 = archive_entry_acl_from_text
                    (entry,
                     "user::r-x\ngroup::r-x\nother::---\nuser:user101:r-x:101\ngroup:group79:--x:79"
                     ,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ĥ',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text(ae, acltext[7], ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ħ',entry,(archive_test_acl_t *)acls0,L'\v',L'̀',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ĩ',0xb,"11",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",(void *)0x0);
  archive_entry_acl_clear(entry);
  pwVar2 = convert_s_to_ws(
                          "user::rwx\ngroup::r-x\nother::r-x\nuser:user100:r-x:100\nuser:user1000:---:1000\ngroup:group78:rwx:78"
                          );
  wVar1 = archive_entry_acl_from_text_w(entry,pwVar2,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'İ',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text_w(ae, ws, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ĳ',entry,(archive_test_acl_t *)acls0,L'\v',L'Ā',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'Ā');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ĵ',6,"6",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_ACCESS)",(void *)0x0);
  free(pwVar2);
  pwVar2 = convert_s_to_ws(
                          "user::r-x\ngroup::r-x\nother::---\nuser:user101:r-x:101\ngroup:group79:--x:79"
                          );
  wVar1 = archive_entry_acl_from_text_w(entry,pwVar2,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ļ',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text_w(ae, ws, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ľ',entry,(archive_test_acl_t *)acls0,L'\v',L'̀',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ŀ',0xb,"11",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",(void *)0x0);
  archive_entry_acl_clear(entry);
  wVar1 = archive_entry_acl_from_text
                    (entry,
                     "user::r-x\ngroup::r-x\nother::---\nuser:user101:r-x:101\ngroup:group79:--x:79"
                     ,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ņ',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text(ae, acltext[7], ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ň',entry,(archive_test_acl_t *)acls0,L'\v',L'Ȁ',L'\0');
  wVar1 = archive_entry_acl_reset(entry,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'ŉ',5,"5",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",(void *)0x0);
  archive_entry_acl_clear(entry);
  wVar1 = archive_entry_acl_from_text_w(entry,pwVar2,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'ŏ',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text_w(ae, ws, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'ő',entry,(archive_test_acl_t *)acls0,L'\v',L'Ȁ',L'\0');
  wVar1 = archive_entry_acl_reset(entry,L'Ȁ');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'œ',5,"5",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_DEFAULT)",(void *)0x0);
  archive_entry_acl_clear(entry);
  wVar1 = archive_entry_acl_from_text
                    (entry,
                     "user::rwx\ngroup::r-x\nother::r-x\nuser:user100:r-x:100\nuser:user1000:---:1000\ngroup:group78:rwx:78\ndefault:user::r-x\ndefault:group::r-x\ndefault:other::---\ndefault:user:user101:r-x:101\ndefault:group:group79:--x:79"
                     ,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'ř',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text(ae, acltext[1], ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'ś',entry,(archive_test_acl_t *)acls0,L'\v',L'̀',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'ŝ',0xb,"11",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",(void *)0x0);
  archive_entry_acl_clear(entry);
  free(pwVar2);
  pwVar2 = convert_s_to_ws(
                          "user::rwx\ngroup::r-x\nother::r-x\nuser:user100:r-x:100\nuser:user1000:---:1000\ngroup:group78:rwx:78\ndefault:user::r-x\ndefault:group::r-x\ndefault:other::---\ndefault:user:user101:r-x:101\ndefault:group:group79:--x:79"
                          );
  wVar1 = archive_entry_acl_from_text_w(entry,pwVar2,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ť',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text_w(ae, ws, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ŧ',entry,(archive_test_acl_t *)acls0,L'\v',L'̀',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ũ',0xb,"11",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",(void *)0x0);
  archive_entry_acl_clear(entry);
  wVar1 = archive_entry_acl_from_text
                    (entry,
                     "u::rwx\ng::r-x\no::r-x\nu:user100:r-x:100\nu:user1000:---:1000\ng:group78:rwx:78\nd:user::r-x\nd:group::r-x\nd:other::---\nd:user:user101:r-x:101\nd:group:group79:--x:79"
                     ,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ů',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text(ae, acltext[2], ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ű',entry,(archive_test_acl_t *)acls0,L'\v',L'̀',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ų',0xb,"11",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",(void *)0x0);
  archive_entry_acl_clear(entry);
  free(pwVar2);
  pwVar2 = convert_s_to_ws(
                          "u::rwx\ng::r-x\no::r-x\nu:user100:r-x:100\nu:user1000:---:1000\ng:group78:rwx:78\nd:user::r-x\nd:group::r-x\nd:other::---\nd:user:user101:r-x:101\nd:group:group79:--x:79"
                          );
  wVar1 = archive_entry_acl_from_text_w(entry,pwVar2,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ź',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text_w(ae, ws, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ż',entry,(archive_test_acl_t *)acls0,L'\v',L'̀',L'ǭ');
  wVar1 = archive_entry_acl_reset(entry,L'̀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ž',0xb,"11",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_POSIX1E)",(void *)0x0);
  archive_entry_acl_clear(entry);
  wVar1 = archive_entry_acl_from_text
                    (entry,
                     "user:user77:rw-p--a-R-c-o-:-------:allow:77\nuser:user101:-w-pdD--------:fdin---:deny:101\ngroup:group78:r-----a-R-c---:------I:allow:78\nowner@:rwxp--aARWcCo-:-------:allow\ngroup@:rw-p--a-R-c---:-------:allow\neveryone@:r-----a-R-c--s:-------:allow"
                     ,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'ƃ',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text(ae, acltext[10], ARCHIVE_ENTRY_ACL_TYPE_NFS4)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'ƅ',entry,(archive_test_acl_t *)acls1,L'\x06',L'㰀',L'\0');
  wVar1 = archive_entry_acl_reset(entry,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ƈ',6,"6",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  archive_entry_acl_clear(entry);
  free(pwVar2);
  pwVar2 = convert_s_to_ws(
                          "user:user77:rw-p--a-R-c-o-:-------:allow:77\nuser:user101:-w-pdD--------:fdin---:deny:101\ngroup:group78:r-----a-R-c---:------I:allow:78\nowner@:rwxp--aARWcCo-:-------:allow\ngroup@:rw-p--a-R-c---:-------:allow\neveryone@:r-----a-R-c--s:-------:allow"
                          );
  wVar1 = archive_entry_acl_from_text_w(entry,pwVar2,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ə',0,"ARCHIVE_OK",(long)wVar1,
                      "archive_entry_acl_from_text_w(ae, ws, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",
                      (void *)0x0);
  assertion_entry_compare_acls
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
             ,L'Ƒ',entry,(archive_test_acl_t *)acls1,L'\x06',L'㰀',L'\0');
  wVar1 = archive_entry_acl_reset(entry,L'㰀');
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                      ,L'Ɠ',6,"6",(long)wVar1,
                      "archive_entry_acl_reset(ae, ARCHIVE_ENTRY_ACL_TYPE_NFS4)",(void *)0x0);
  archive_entry_acl_clear(entry);
  free(pwVar2);
  archive_entry_free(entry);
  return;
}

Assistant:

DEFINE_TEST(test_acl_from_text)
{
	struct archive_entry *ae;
	wchar_t *ws = NULL;

	/* Create an empty archive_entry. */
	assert((ae = archive_entry_new()) != NULL);

	/* 1a. Read POSIX.1e access ACLs from text */
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text(ae, acltext[5],
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0755);
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));

	/* 1b. Now read POSIX.1e default ACLs and append them */
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text(ae, acltext[7],
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E, 0755);
	assertEqualInt(11, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	archive_entry_acl_clear(ae);

	/* 1a and 1b with wide strings */
	ws = convert_s_to_ws(acltext[5]);

	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text_w(ae, ws,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS, 0755);
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_ACCESS));

	free(ws);
	ws = convert_s_to_ws(acltext[7]);

	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text_w(ae, ws,
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E, 0755);
	assertEqualInt(11, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	archive_entry_acl_clear(ae);

	/* 2. Read POSIX.1e default ACLs from text */
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text(ae, acltext[7],
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT, 0);
	assertEqualInt(5, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	archive_entry_acl_clear(ae);

	/* ws is still acltext[7] */
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text_w(ae, ws,
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT, 0);
	assertEqualInt(5, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_DEFAULT));
	archive_entry_acl_clear(ae);

	/* 3. Read POSIX.1e access and default ACLs from text */
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text(ae, acltext[1],
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E, 0755);
	assertEqualInt(11, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	archive_entry_acl_clear(ae);

	free(ws);
	ws = convert_s_to_ws(acltext[1]);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text_w(ae, ws,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E, 0755);
	assertEqualInt(11, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	archive_entry_acl_clear(ae);

	/* 4. Read POSIX.1e access and default ACLs from text (short form) */
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text(ae, acltext[2],
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E, 0755);
	assertEqualInt(11, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	archive_entry_acl_clear(ae);

	free(ws);
	ws = convert_s_to_ws(acltext[2]);
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text_w(ae, ws,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	assertEntryCompareAcls(ae, acls0, sizeof(acls0)/sizeof(acls0[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E, 0755);
	assertEqualInt(11, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_POSIX1E));
	archive_entry_acl_clear(ae);

	/* 5. Read NFSv4 ACLs from text */
	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text(ae, acltext[10],
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	archive_entry_acl_clear(ae);

	free(ws);
	ws = convert_s_to_ws(acltext[10]);

	assertEqualInt(ARCHIVE_OK,
	    archive_entry_acl_from_text_w(ae, ws,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	assertEntryCompareAcls(ae, acls1, sizeof(acls1)/sizeof(acls1[0]),
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4, 0);
	assertEqualInt(6, archive_entry_acl_reset(ae,
	    ARCHIVE_ENTRY_ACL_TYPE_NFS4));
	archive_entry_acl_clear(ae);

	free(ws);
	archive_entry_free(ae);
}